

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O1

void remora::bindings::
     pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
               (long *A,long p)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  
  uVar2 = A[1];
  uVar1 = uVar2 + 3;
  if (3 < uVar1) {
    lVar5 = *A;
    lVar3 = A[3];
    lVar4 = A[2];
    lVar7 = 0;
    uVar8 = 0;
    lVar10 = 0;
    do {
      if (lVar4 != 0) {
        lVar6 = 0;
        lVar9 = lVar5;
        do {
          lVar11 = lVar10;
          lVar10 = 0;
          do {
            uVar12 = 0;
            if ((ulong)(lVar7 + lVar10) < uVar2) {
              uVar12 = *(undefined8 *)(lVar9 + lVar10 * 8);
            }
            *(undefined8 *)(p + lVar11 * 8 + lVar10 * 8) = uVar12;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar6 = lVar6 + 1;
          lVar9 = lVar9 + lVar3 * 8;
          lVar10 = lVar11 + 4;
        } while (lVar6 != lVar4);
        lVar10 = lVar11 + 4;
      }
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x20;
      lVar7 = lVar7 + 4;
    } while (uVar8 != uVar1 >> 2);
  }
  return;
}

Assistant:

size_type size1() const {
		return m_size1;
	}